

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionWrapper.cpp
# Opt level: O2

Statement * __thiscall
IRT::ExpressionWrapper::ToConditional(ExpressionWrapper *this,Label *true_label,Label *false_label)

{
  Expression *left;
  JumpConditionalStatement *this_00;
  ConstExpression *this_01;
  Label local_70;
  Label local_50;
  
  this_00 = (JumpConditionalStatement *)operator_new(0x60);
  left = this->expression_;
  this_01 = (ConstExpression *)operator_new(0x10);
  ConstExpression::ConstExpression(this_01,0);
  std::__cxx11::string::string((string *)&local_70,(string *)true_label);
  std::__cxx11::string::string((string *)&local_50,(string *)false_label);
  JumpConditionalStatement::JumpConditionalStatement
            (this_00,NE,left,(Expression *)this_01,&local_70,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return &this_00->super_Statement;
}

Assistant:

IRT::Statement *IRT::ExpressionWrapper::ToConditional(IRT::Label true_label, IRT::Label false_label) {
    return new JumpConditionalStatement(
          LogicOperatorType::NE,
          expression_,
          new ConstExpression(0),
          true_label,
          false_label
    );
}